

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O3

void deqp::gles2::Functional::anon_unknown_1::checkColorAttachmentParam
               (TestContext *testCtx,CallLogWrapper *gl,GLenum target,GLenum pname,GLenum reference)

{
  ostringstream *this;
  int iVar1;
  bool bVar2;
  StateQueryMemoryWriteGuard<int> state;
  StateQueryMemoryWriteGuard<int> local_1ac;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1ac.m_preguard = -0x21212122;
  local_1ac.m_value = -0x21212122;
  local_1ac.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv
            (gl,0x8d40,0x8ce0,target,&local_1ac.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1ac,testCtx);
  if ((bVar2) && (iVar1 = local_1ac.m_value, local_1ac.m_value != pname)) {
    local_1a0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ERROR: Expected ",0x13);
    std::ostream::operator<<(this,pname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
    std::ostream::operator<<(this,iVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_128);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  return;
}

Assistant:

void checkColorAttachmentParam(tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLenum target, GLenum pname, GLenum reference)
{
	checkAttachmentParam(testCtx, gl, target, GL_COLOR_ATTACHMENT0, pname, reference);
}